

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::Call(SQVM *this,SQObjectPtr *closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr *outres
          ,SQBool raiseerror)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQTable *pSVar5;
  SQTable *pSVar6;
  bool bVar7;
  SQChar *pSVar8;
  bool dummy;
  SQObjectValue local_48;
  SQObjectPtr temp;
  
  SVar2 = (closure->super_SQObject)._type;
  if (SVar2 == OT_CLASS) {
    _dummy = OT_NULL;
    local_48.pTable = (SQTable *)0x0;
    temp.super_SQObject._type = OT_NULL;
    temp.super_SQObject._unVal.pTable = (SQTable *)0x0;
    CreateClassInstance(this,(closure->super_SQObject)._unVal.pClass,outres,(SQObjectPtr *)&dummy);
    if ((_dummy == OT_NATIVECLOSURE) || (bVar7 = true, _dummy == OT_CLOSURE)) {
      pSVar4 = (this->_stack)._vals;
      SVar2 = pSVar4[stackbase].super_SQObject._type;
      pSVar5 = pSVar4[stackbase].super_SQObject._unVal.pTable;
      pSVar6 = (outres->super_SQObject)._unVal.pTable;
      pSVar4[stackbase].super_SQObject._unVal.pTable = pSVar6;
      SVar3 = (outres->super_SQObject)._type;
      pSVar4[stackbase].super_SQObject._type = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      bVar7 = Call(this,(SQObjectPtr *)&dummy,nparams,stackbase,&temp,raiseerror);
    }
    SQObjectPtr::~SQObjectPtr(&temp);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&dummy);
  }
  else if (SVar2 == OT_NATIVECLOSURE) {
    bVar7 = CallNative(this,(closure->super_SQObject)._unVal.pNativeClosure,nparams,stackbase,outres
                       ,-1,&dummy,&dummy);
  }
  else if (SVar2 == OT_CLOSURE) {
    bVar7 = Execute(this,closure,nparams,stackbase,outres,raiseerror,ET_CALL);
  }
  else {
    pSVar8 = GetTypeName(closure);
    bVar7 = false;
    Raise_Error(this,"attempt to call \'%s\'",pSVar8);
  }
  return bVar7;
}

Assistant:

bool SQVM::Call(SQObjectPtr &closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr &outres,SQBool raiseerror)
{
#ifdef _DEBUG
SQInteger prevstackbase = _stackbase;
#endif
    switch(sq_type(closure)) {
    case OT_CLOSURE:
        return Execute(closure, nparams, stackbase, outres, raiseerror);
        break;
    case OT_NATIVECLOSURE:{
        bool dummy;
        return CallNative(_nativeclosure(closure), nparams, stackbase, outres, -1, dummy, dummy);

                          }
        break;
    case OT_CLASS: {
        SQObjectPtr constr;
        SQObjectPtr temp;
        CreateClassInstance(_class(closure),outres,constr);
        SQObjectType ctype = sq_type(constr);
        if (ctype == OT_NATIVECLOSURE || ctype == OT_CLOSURE) {
            _stack[stackbase] = outres;
            return Call(constr,nparams,stackbase,temp,raiseerror);
        }
        return true;
                   }
        break;
    default:
        Raise_Error(_SC("attempt to call '%s'"), GetTypeName(closure));
        return false;
    }
#ifdef _DEBUG
    if(!_suspended) {
        assert(_stackbase == prevstackbase);
    }
#endif
    return true;
}